

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O2

Aig_Obj_t * Aig_IthVar(Aig_Man_t *p,int i)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  
  for (iVar2 = p->nObjs[2]; iVar2 <= i; iVar2 = iVar2 + 1) {
    Aig_ObjCreateCi(p);
  }
  if (i < p->vCis->nSize) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,i);
    return pAVar1;
  }
  __assert_fail("i < Vec_PtrSize(p->vCis)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOper.c"
                ,0x44,"Aig_Obj_t *Aig_IthVar(Aig_Man_t *, int)");
}

Assistant:

Aig_Obj_t * Aig_IthVar( Aig_Man_t * p, int i )
{
    int v;
    for ( v = Aig_ManCiNum(p); v <= i; v++ )
        Aig_ObjCreateCi( p );
    assert( i < Vec_PtrSize(p->vCis) );
    return Aig_ManCi( p, i );
}